

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_NormalizedBoundaries(void)

{
  int32_t line;
  char *file;
  uint64_t uVar1;
  uint64_t uVar2;
  DiyFp *out_m_plus;
  DiyFp *out_m_minus;
  DiyFp DVar3;
  uint64_t max_double64;
  uint64_t largest_denormal64;
  uint64_t smallest_normal64;
  uint64_t min_double64;
  DiyFp diy_fp;
  DiyFp boundary_minus;
  DiyFp boundary_plus;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  undefined1 condition;
  Double *this;
  int expected;
  Double *in_stack_fffffffffffffd00;
  Double *this_00;
  int in_stack_fffffffffffffd0c;
  char *in_stack_fffffffffffffd10;
  DiyFp *in_stack_fffffffffffffda0;
  DiyFp *in_stack_fffffffffffffda8;
  Double *in_stack_fffffffffffffdb0;
  Double *this_01;
  Double local_160;
  uint64_t local_158;
  int32_t local_150;
  Double local_148;
  uint64_t local_140;
  int32_t local_138;
  uint64_t local_130;
  Double local_128;
  uint64_t local_120;
  int32_t local_118;
  Double local_110;
  uint64_t local_108;
  int32_t local_100;
  uint64_t local_f8;
  Double local_f0;
  uint64_t local_e8;
  int32_t local_e0;
  Double local_d8;
  uint64_t local_d0;
  int32_t local_c8;
  uint64_t local_c0;
  Double local_b8;
  uint64_t local_b0;
  int32_t local_a8;
  Double local_a0;
  uint64_t local_98;
  int32_t local_90;
  uint64_t local_88;
  uint64_t local_78;
  int32_t local_70;
  uint64_t local_60;
  int32_t local_58;
  Double local_50;
  uint64_t local_48;
  int32_t local_40;
  Double local_38;
  DiyFp local_30;
  DiyFp local_20;
  DiyFp local_10;
  
  double_conversion::DiyFp::DiyFp(&local_10);
  double_conversion::DiyFp::DiyFp(&local_20);
  this = &local_38;
  expected = 0x3ff80000;
  double_conversion::Double::Double
            (this,(double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(in_stack_fffffffffffffd00);
  local_48 = DVar3.f_;
  local_40 = DVar3.e_;
  this_00 = &local_50;
  local_30.f_ = local_48;
  local_30.e_ = local_40;
  double_conversion::Double::Double
            (this,(double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  double_conversion::Double::NormalizedBoundaries
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,(char *)this_00,expected,
                    (char *)this,in_stack_fffffffffffffcec);
  line = double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(in_stack_fffffffffffffd10,line,(char *)this_00,expected,(char *)this,
                    in_stack_fffffffffffffcec);
  file = (char *)double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::Double::Double
            (this,(double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(this_00);
  local_78 = DVar3.f_;
  local_70 = DVar3.e_;
  local_60 = local_78;
  local_58 = local_70;
  local_30.f_ = local_78;
  local_30.e_ = local_70;
  double_conversion::Double::Double
            (this,(double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  double_conversion::Double::NormalizedBoundaries
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  local_88 = 1;
  double_conversion::Double::Double(&local_a0,1);
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(this_00);
  local_b0 = DVar3.f_;
  local_a8 = DVar3.e_;
  local_98 = local_b0;
  local_90 = local_a8;
  local_30.f_ = local_b0;
  local_30.e_ = local_a8;
  double_conversion::Double::Double(&local_b8,local_88);
  double_conversion::Double::NormalizedBoundaries
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  uVar1 = double_conversion::DiyFp::f(&local_30);
  uVar2 = double_conversion::DiyFp::f(&local_20);
  out_m_plus = (DiyFp *)(uVar1 - uVar2);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  out_m_minus = (DiyFp *)double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  local_c0 = 0x10000000000000;
  this_01 = &local_d8;
  double_conversion::Double::Double(this_01,0x10000000000000);
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(this_00);
  local_e8 = DVar3.f_;
  local_e0 = DVar3.e_;
  local_d0 = local_e8;
  local_c8 = local_e0;
  local_30.f_ = local_e8;
  local_30.e_ = local_e0;
  double_conversion::Double::Double(&local_f0,local_c0);
  double_conversion::Double::NormalizedBoundaries(this_01,out_m_minus,out_m_plus);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  local_f8 = 0xfffffffffffff;
  double_conversion::Double::Double(&local_110,0xfffffffffffff);
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(this_00);
  local_120 = DVar3.f_;
  local_118 = DVar3.e_;
  local_108 = local_120;
  local_100 = local_118;
  local_30.f_ = local_120;
  local_30.e_ = local_118;
  double_conversion::Double::Double(&local_128,local_f8);
  double_conversion::Double::NormalizedBoundaries(this_01,out_m_minus,out_m_plus);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0)
             );
  local_130 = 0x7fefffffffffffff;
  double_conversion::Double::Double(&local_148,0x7fefffffffffffff);
  DVar3 = double_conversion::Double::AsNormalizedDiyFp(this_00);
  local_158 = DVar3.f_;
  local_150 = DVar3.e_;
  local_140 = local_158;
  local_138 = local_150;
  local_30.f_ = local_158;
  local_30.e_ = local_150;
  double_conversion::Double::Double(&local_160,local_130);
  double_conversion::Double::NormalizedBoundaries(this_01,out_m_minus,out_m_plus);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_20);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  double_conversion::DiyFp::e(&local_30);
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file,line,(char *)this_00,expected,(char *)this,in_stack_fffffffffffffcec);
  condition = (undefined1)((uint)in_stack_fffffffffffffcec >> 0x18);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  double_conversion::DiyFp::f(&local_10);
  double_conversion::DiyFp::f(&local_30);
  CheckHelper((char *)this_00,expected,(char *)this,(bool)condition);
  double_conversion::DiyFp::f(&local_30);
  double_conversion::DiyFp::f(&local_20);
  CheckHelper((char *)this_00,expected,(char *)this,(bool)condition);
  return;
}

Assistant:

TEST(Double_NormalizedBoundaries) {
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp diy_fp = Double(1.5).AsNormalizedDiyFp();
  Double(1.5).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.5 does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  diy_fp = Double(1.0).AsNormalizedDiyFp();
  Double(1.0).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.0 does have a significand of the form 2^p (for some p).
  // Therefore its lower boundary is twice as close as the upper boundary.
  CHECK(boundary_plus.f() - diy_fp.f() > diy_fp.f() - boundary_minus.f());
  CHECK((1 << 9) == diy_fp.f() - boundary_minus.f());  // NOLINT
  CHECK((1 << 10) == boundary_plus.f() - diy_fp.f());  // NOLINT

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  diy_fp = Double(min_double64).AsNormalizedDiyFp();
  Double(min_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // min-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  // Denormals have their boundaries much closer.
  CHECK((static_cast<uint64_t>(1) << 62) ==
        diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  diy_fp = Double(smallest_normal64).AsNormalizedDiyFp();
  Double(smallest_normal64).NormalizedBoundaries(&boundary_minus,
                                                 &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // Even though the significand is of the form 2^p (for some p), its boundaries
  // are at the same distance. (This is the only exception).
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  diy_fp = Double(largest_denormal64).AsNormalizedDiyFp();
  Double(largest_denormal64).NormalizedBoundaries(&boundary_minus,
                                                  &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 11) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  diy_fp = Double(max_double64).AsNormalizedDiyFp();
  Double(max_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // max-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT
}